

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpath_selector.hpp
# Opt level: O0

reference __thiscall
jsoncons::jsonpath::detail::
index_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
::evaluate(index_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
           *this,eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                 *context,reference root,path_node_type *last,reference current,
          result_options options,error_code *ec)

{
  bool bVar1;
  size_t sVar2;
  path_node_type *ppVar3;
  error_code *ec_00;
  reference pbVar4;
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *in_RDX;
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *in_RSI;
  size_t in_RDI;
  size_t i_1;
  int64_t index;
  size_t i;
  int64_t slen;
  undefined8 in_stack_ffffffffffffff70;
  result_options rVar5;
  reference in_stack_ffffffffffffff78;
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *in_stack_ffffffffffffff80;
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *in_stack_ffffffffffffff88;
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *in_stack_ffffffffffffff90;
  base_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *in_stack_ffffffffffffff98;
  error_code *in_stack_ffffffffffffffb0;
  size_t i_00;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_fffffffffffffff8;
  
  i_00 = in_RDI;
  bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_array
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                     in_stack_ffffffffffffff88);
  if (bVar1) {
    sVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size
                      (in_stack_ffffffffffffff78);
    if ((*(long *)(in_RDI + 0x20) < 0) || ((long)sVar2 <= *(long *)(in_RDI + 0x20))) {
      ec_00 = (error_code *)(sVar2 + *(long *)(in_RDI + 0x20));
      if (((long)ec_00 < 0) || ((long)sVar2 <= (long)ec_00)) {
        pbVar4 = eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                 ::null_value(in_stack_ffffffffffffff80);
      }
      else {
        rVar5 = (result_options)((ulong)in_RSI >> 0x20);
        ppVar3 = path_generator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                 ::generate(in_stack_ffffffffffffff88,(path_node_type *)in_stack_ffffffffffffff80,
                            (size_t)in_RDX,rVar5);
        basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                  (in_stack_fffffffffffffff8,i_00);
        pbVar4 = base_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                 ::evaluate_tail(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                                 (reference)in_stack_ffffffffffffff88,ppVar3,(reference)in_RDX,rVar5
                                 ,ec_00);
      }
    }
    else {
      rVar5 = (result_options)((ulong)in_stack_ffffffffffffff70 >> 0x20);
      ppVar3 = path_generator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
               ::generate(in_RSI,(path_node_type *)in_stack_ffffffffffffff80,
                          (size_t)in_stack_ffffffffffffff78,rVar5);
      basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                (in_stack_fffffffffffffff8,i_00);
      pbVar4 = base_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
               ::evaluate_tail((base_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                                *)ppVar3,in_RDX,(reference)in_RSI,
                               (path_node_type *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78
                               ,rVar5,in_stack_ffffffffffffffb0);
    }
  }
  else {
    pbVar4 = eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
             ::null_value(in_stack_ffffffffffffff80);
  }
  return pbVar4;
}

Assistant:

reference evaluate(eval_context<Json,JsonReference>& context,
                           reference root,
                           const path_node_type& last, 
                           reference current, 
                           result_options options,
                           std::error_code& ec) const override
        {
            if (current.is_array())
            {
                auto slen = static_cast<int64_t>(current.size());
                if (index_ >= 0 && index_ < slen)
                {
                    auto i = static_cast<std::size_t>(index_);
                    return this->evaluate_tail(context, root, 
                                        path_generator_type::generate(context, last, i, options), 
                                        current.at(i), options, ec);
                }
                int64_t index = slen + index_;
                if (index >= 0 && index < slen)
                {
                    auto i = static_cast<std::size_t>(index);
                    return this->evaluate_tail(context, root, 
                                        path_generator_type::generate(context, last, i, options), 
                                        current.at(i), options, ec);
                }
                return context.null_value();
            }
            return context.null_value();
        }